

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O2

void __thiscall
DStrobe::DStrobe(DStrobe *this,sector_t *sector,int upper,int lower,int utics,int ltics)

{
  int iVar1;
  
  DLighting::DLighting(&this->super_DLighting,sector);
  (this->super_DLighting).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_006f3488;
  this->m_DarkTime = ltics;
  this->m_BrightTime = utics;
  if (0x7ffe < upper) {
    upper = 0x7fff;
  }
  if (upper < -0x7fff) {
    upper = -0x8000;
  }
  this->m_MaxLight = upper;
  iVar1 = 0x7fff;
  if (lower < 0x7fff) {
    iVar1 = lower;
  }
  if (iVar1 < -0x7fff) {
    iVar1 = -0x8000;
  }
  this->m_MinLight = iVar1;
  this->m_Count = 1;
  return;
}

Assistant:

DStrobe::DStrobe (sector_t *sector, int upper, int lower, int utics, int ltics)
	: DLighting (sector)
{
	m_DarkTime = ltics;
	m_BrightTime = utics;
	m_MaxLight = sector_t::ClampLight(upper);
	m_MinLight = sector_t::ClampLight(lower);
	m_Count = 1;	// Hexen-style is always in sync
}